

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

string * __thiscall
cmTargetIncludeDirectoriesCommand::Join
          (string *__return_storage_ptr__,cmTargetIncludeDirectoriesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  bool bVar1;
  char *__lhs;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer input;
  string prefix;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50.field_2._M_local_buf[0] = '\0';
  __lhs = cmMakefile::GetCurrentSourceDirectory
                    ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
  std::__cxx11::string::string((string *)&local_b0,"/",(allocator *)&local_90);
  std::operator+(&local_70,__lhs,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  input = (content->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (input == (content->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath((input->_M_dataplus)._M_p);
    if (bVar1) {
LAB_003e2632:
      std::operator+(&local_b0,&local_50,input);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_00 = &local_b0;
    }
    else {
      sVar2 = cmGeneratorExpression::Find(input);
      if (sVar2 == 0) goto LAB_003e2632;
      std::operator+(&local_90,&local_50,&local_70);
      std::operator+(&local_b0,&local_90,input);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      this_00 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::assign((char *)&local_50);
    input = input + 1;
  } while( true );
}

Assistant:

std::string cmTargetIncludeDirectoriesCommand
::Join(const std::vector<std::string> &content)
{
  std::string dirs;
  std::string sep;
  std::string prefix =
      this->Makefile->GetCurrentSourceDirectory() + std::string("/");
  for(std::vector<std::string>::const_iterator it = content.begin();
    it != content.end(); ++it)
    {
    if (cmSystemTools::FileIsFullPath(it->c_str())
        || cmGeneratorExpression::Find(*it) == 0)
      {
      dirs += sep + *it;
      }
    else
      {
      dirs += sep + prefix + *it;
      }
    sep = ";";
    }
  return dirs;
}